

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakDetector::deallocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,void *memory,char *file,
          size_t line,bool allocatNodesSeperately)

{
  MemoryLeakFailure *reporter;
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  TestMemoryAllocator *allocAllocator;
  MemoryLeakDetectorNode *pMVar4;
  MemoryLeakDetectorList *pMVar5;
  MemoryLeakDetectorNode *node;
  
  if (memory != (void *)0x0) {
    uVar3 = (int)memory + (int)((ulong)memory / 0x49) * -0x49;
    node = (this->memoryTable_).table_[uVar3].head_;
    if (node == (MemoryLeakDetectorNode *)0x0) {
LAB_002bc67e:
      reporter = this->reporter_;
      allocAllocator = NullUnknownAllocator::defaultAllocator();
      MemoryLeakOutputStringBuffer::reportFailure
                (&this->outputBuffer_,"Deallocating non-allocated memory\n","<unknown>",0,0,
                 allocAllocator,file,line,allocator,reporter);
    }
    else {
      if (node->memory_ == (char *)memory) {
        pMVar4 = (MemoryLeakDetectorNode *)0x0;
      }
      else {
        do {
          pMVar4 = node;
          node = pMVar4->next_;
          if (node == (MemoryLeakDetectorNode *)0x0) goto LAB_002bc67e;
        } while (node->memory_ != (char *)memory);
      }
      pMVar5 = (MemoryLeakDetectorList *)&pMVar4->next_;
      if (pMVar4 == (MemoryLeakDetectorNode *)0x0) {
        pMVar5 = (this->memoryTable_).table_ + uVar3;
      }
      pMVar5->head_ = node->next_;
      bVar2 = TestMemoryAllocator::hasBeenDestroyed(allocator);
      if (!bVar2) {
        sVar1 = node->size_;
        checkForCorruption(this,node,file,line,allocator,allocatNodesSeperately);
        (*allocator->_vptr_TestMemoryAllocator[3])(allocator,memory,sVar1,file,line);
        return;
      }
    }
  }
  return;
}

Assistant:

void MemoryLeakDetector::deallocMemory(TestMemoryAllocator* allocator, void* memory, const char* file, size_t line, bool allocatNodesSeperately)
{
    if (memory == NULLPTR) return;

    MemoryLeakDetectorNode* node = memoryTable_.removeNode((char*) memory);
    if (node == NULLPTR) {
        outputBuffer_.reportDeallocateNonAllocatedMemoryFailure(file, line, allocator, reporter_);
        return;
    }
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    if (!allocator->hasBeenDestroyed()) {
        size_t size = node->size_;
        checkForCorruption(node, file, line, allocator, allocatNodesSeperately);
        allocator->free_memory((char*) memory, size, file, line);
    }
}